

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

uchar flatbuffers::JsonPrinter::GetFieldDefault<unsigned_char>(FieldDef *fd)

{
  char *s;
  bool bVar1;
  uchar local_11;
  bool check;
  FieldDef *pFStack_10;
  uchar val;
  FieldDef *fd_local;
  
  local_11 = '\0';
  pFStack_10 = fd;
  s = (char *)std::__cxx11::string::c_str();
  bVar1 = StringToNumber<unsigned_char>(s,&local_11);
  if (bVar1) {
    return local_11;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = unsigned char]"
               );
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }